

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::conv1d_wide(expr *this,Expression *x,Expression *f)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_28;
  uint local_24;
  undefined1 *local_20;
  undefined8 local_18;
  
  local_20 = (undefined1 *)&local_28;
  arguments = x->pg;
  local_28 = (x->i).t;
  local_24 = (f->i).t;
  local_18 = 2;
  ComputationGraph::add_function<cnn::Conv1DWide>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression conv1d_wide(const Expression& x, const Expression& f) { return Expression(x.pg, x.pg->add_function<Conv1DWide>({x.i, f.i})); }